

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseExtParsedEnt(xmlParserCtxtPtr ctxt)

{
  setDocumentLocatorSAXFunc p_Var1;
  void *pvVar2;
  xmlCharEncoding enc_00;
  xmlSAXLocator *pxVar3;
  xmlChar *pxVar4;
  int iVar5;
  xmlChar local_1c;
  xmlChar local_1b;
  xmlChar local_1a;
  xmlChar local_19;
  xmlCharEncoding enc;
  xmlChar start [4];
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    return -1;
  }
  _enc = ctxt;
  xmlDefaultSAXHandlerInit();
  xmlDetectSAX2(_enc);
  if ((_enc->progressive == 0) && ((long)_enc->input->end - (long)_enc->input->cur < 0xfa)) {
    xmlGROW(_enc);
  }
  if ((_enc->sax != (_xmlSAXHandler *)0x0) &&
     (_enc->sax->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0)) {
    p_Var1 = _enc->sax->setDocumentLocator;
    pvVar2 = _enc->userData;
    pxVar3 = __xmlDefaultSAXLocator();
    (*p_Var1)(pvVar2,pxVar3);
  }
  if (3 < (long)_enc->input->end - (long)_enc->input->cur) {
    local_1c = *_enc->input->cur;
    local_1b = _enc->input->cur[1];
    local_1a = _enc->input->cur[2];
    local_19 = _enc->input->cur[3];
    enc_00 = xmlDetectCharEncoding(&local_1c,4);
    if (enc_00 != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(_enc,enc_00);
    }
  }
  if (*_enc->input->cur == '\0') {
    xmlFatalErr(_enc,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
  }
  if ((_enc->progressive == 0) && ((long)_enc->input->end - (long)_enc->input->cur < 0xfa)) {
    xmlGROW(_enc);
  }
  if ((((((_enc->mlType == XML_TYPE_XML) && (*_enc->input->cur == '<')) &&
        (_enc->input->cur[1] == '?')) &&
       ((_enc->input->cur[2] == 'x' && (_enc->input->cur[3] == 'm')))) &&
      (_enc->input->cur[4] == 'l')) ||
     (((_enc->mlType == XML_TYPE_SML && (*_enc->input->cur == '?')) &&
      ((_enc->input->cur[1] == 'x' && ((_enc->input->cur[2] == 'm' && (_enc->input->cur[3] == 'l')))
       ))))) {
    iVar5 = 4;
    if (_enc->mlType == XML_TYPE_XML) {
      iVar5 = 5;
    }
    if (_enc->input->cur[iVar5] != ' ') {
      iVar5 = 4;
      if (_enc->mlType == XML_TYPE_XML) {
        iVar5 = 5;
      }
      if (8 < _enc->input->cur[iVar5]) {
        iVar5 = 4;
        if (_enc->mlType == XML_TYPE_XML) {
          iVar5 = 5;
        }
        if (_enc->input->cur[iVar5] < 0xb) goto LAB_0018ccab;
      }
      iVar5 = 4;
      if (_enc->mlType == XML_TYPE_XML) {
        iVar5 = 5;
      }
      if (_enc->input->cur[iVar5] != '\r') goto LAB_0018ccd8;
    }
LAB_0018ccab:
    xmlParseXMLDecl(_enc);
    if (_enc->errNo == 0x20) {
      return -1;
    }
    xmlSkipBlankChars(_enc);
  }
  else {
LAB_0018ccd8:
    pxVar4 = xmlCharStrdup("1.0");
    _enc->version = pxVar4;
  }
  if (((_enc->sax != (_xmlSAXHandler *)0x0) &&
      (_enc->sax->startDocument != (startDocumentSAXFunc)0x0)) && (_enc->disableSAX == 0)) {
    (*_enc->sax->startDocument)(_enc->userData);
  }
  if (_enc->instate == XML_PARSER_EOF) {
    ctxt_local._4_4_ = -1;
  }
  else {
    _enc->instate = XML_PARSER_CONTENT;
    _enc->validate = 0;
    _enc->loadsubset = 0;
    _enc->depth = 0;
    xmlParseContent(_enc);
    if (_enc->instate == XML_PARSER_EOF) {
      ctxt_local._4_4_ = -1;
    }
    else {
      if ((*_enc->input->cur == '<') && (_enc->input->cur[1] == '/')) {
        xmlFatalErr(_enc,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
      }
      else if (*_enc->input->cur != '\0') {
        xmlFatalErr(_enc,XML_ERR_EXTRA_CONTENT,(char *)0x0);
      }
      if ((_enc->sax != (_xmlSAXHandler *)0x0) &&
         (_enc->sax->endDocument != (endDocumentSAXFunc)0x0)) {
        (*_enc->sax->endDocument)(_enc->userData);
      }
      if (_enc->wellFormed == 0) {
        ctxt_local._4_4_ = -1;
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseExtParsedEnt(xmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    xmlDefaultSAXHandlerInit();

    xmlDetectSAX2(ctxt);

    GROW;

    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);

    /*
     * Get the 4 first bytes and decode the charset
     * if enc != XML_CHAR_ENCODING_NONE
     * plug some encoding conversion routines.
     */
    if ((ctxt->input->end - ctxt->input->cur) >= 4) {
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }


    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
    }

    /*
     * Check for the XMLDecl in the Prolog.
     */
    GROW;
    if ((CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT_MLI(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    return(-1);
	}
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);

    /*
     * Doing validity checking on chunk doesn't make sense
     */
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->validate = 0;
    ctxt->loadsubset = 0;
    ctxt->depth = 0;

    xmlParseContent(ctxt);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);

    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if (! ctxt->wellFormed) return(-1);
    return(0);
}